

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_struct_member
          (CompilerGLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t param_5)

{
  ID *__k;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  Decoration *pDVar1;
  SPIRType *type_00;
  mapped_type *pmVar2;
  ulong uVar3;
  Bitset *pBVar4;
  string qualifiers;
  Bitset memberflags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 local_70 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       member_type_id);
  local_70 = (undefined1  [8])0x0;
  local_68._M_buckets = (__buckets_ptr)(local_70 + 0x38);
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_Compiler).ir.meta;
  __k = &(type->super_IVariant).self;
  pmVar2 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  uVar3 = (ulong)index;
  if (uVar3 < (pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size) {
    pDVar1 = (pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    pBVar4 = &pDVar1[uVar3].decoration_flags;
    local_70 = (undefined1  [8])pBVar4->lower;
    if (pBVar4 != (Bitset *)local_70) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)(local_70 + 8),&pDVar1[uVar3].decoration_flags.higher._M_h);
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  pmVar2 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,__k);
  if (((pmVar2->decoration).decoration_flags.lower & 4) == 0) {
    pmVar2 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    if (((pmVar2->decoration).decoration_flags.lower & 8) == 0) goto LAB_003509c1;
  }
  (*(this->super_Compiler)._vptr_Compiler[0x35])(&local_110,this,local_70);
  ::std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
LAB_003509c1:
  (*(this->super_Compiler)._vptr_Compiler[0x34])(&local_110,this,type,(ulong)index);
  flags_to_qualifiers_glsl_abi_cxx11_(&local_90,this,type_00,(Bitset *)local_70);
  to_member_name_abi_cxx11_(&local_d0,this,type,index);
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_b0,this,type_00,&local_d0,0);
  statement<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,&local_110,&local_f0,qualifier,&local_90,&local_b0,(char (*) [2])0x405f81);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_70 + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string qualifiers;
	bool is_block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
	                ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

	if (is_block)
		qualifiers = to_interpolation_qualifiers(memberflags);

	statement(layout_for_member(type, index), qualifiers, qualifier, flags_to_qualifiers_glsl(membertype, memberflags),
	          variable_decl(membertype, to_member_name(type, index)), ";");
}